

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_lsrk_varjac.c
# Opt level: O1

int check_ans(N_Vector y,sunrealtype t,sunrealtype rtol,sunrealtype atol)

{
  int iVar1;
  double *pdVar2;
  double dVar3;
  
  dVar3 = atan(t);
  pdVar2 = (double *)N_VGetArrayPointer(y);
  if (1.0 <= ABS(*pdVar2 - dVar3) * (1.0 / (ABS(dVar3) * 1e-08 + 1e-08))) {
    iVar1 = fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n");
    return iVar1;
  }
  return (int)pdVar2;
}

Assistant:

static int check_ans(N_Vector y, sunrealtype t, sunrealtype rtol, sunrealtype atol)
{
  int passfail = 0;          /* answer pass (0) or fail (1) flag     */
  sunrealtype ans, err, ewt; /* answer data, error, and error weight */

  /* compute solution error */
  ans = ATAN(t);
  ewt = SUN_RCONST(1.0) / (rtol * SUNRabs(ans) + atol);
  err = ewt * SUNRabs(N_VGetArrayPointer(y)[0] - ans);

  /* is the solution within the tolerances? */
  passfail = (err < SUN_RCONST(1.0)) ? 0 : 1;

  if (passfail)
  {
    fprintf(stdout, "\nSUNDIALS_WARNING: check_ans error=%" GSYM "\n\n", err);
  }

  return (passfail);
}